

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Aig_Man_t * Saig_ManRetimeDupBackward(Aig_Man_t *p,Vec_Ptr_t *vCut,Vec_Int_t *vInit)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  p_00->nRegs = vCut->nSize;
  iVar9 = p->nTruePos;
  p_00->nTruePis = p->nTruePis;
  p_00->nTruePos = iVar9;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar10 = 0;
    do {
      if (p->vCis->nSize <= lVar10) goto LAB_006f875c;
      pvVar2 = p->vCis->pArray[lVar10];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nTruePis);
  }
  if (0 < vCut->nSize) {
    lVar10 = 0;
    do {
      pvVar2 = vCut->pArray[lVar10];
      pAVar6 = Aig_ObjCreateCi(p_00);
      if (vInit == (Vec_Int_t *)0x0) {
        uVar7 = 0;
      }
      else {
        if (vInit->nSize <= lVar10) goto LAB_006f879a;
        uVar7 = (ulong)vInit->pArray[lVar10];
      }
      *(ulong *)((long)pvVar2 + 0x28) = uVar7 ^ (ulong)pAVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCut->nSize);
  }
  if (0 < p->nRegs) {
    iVar9 = 0;
    do {
      uVar3 = p->nTruePos + iVar9;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) goto LAB_006f875c;
      pvVar2 = p->vCos->pArray[uVar3];
      Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
      if (((ulong)pvVar2 & 1) != 0) goto LAB_006f877b;
      uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28);
      }
      *(ulong *)((long)pvVar2 + 0x28) = uVar7;
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->nRegs);
    if (0 < p->nRegs) {
      iVar9 = 0;
      do {
        uVar3 = p->nTruePos + iVar9;
        if (((((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) ||
            (uVar8 = p->nTruePis + iVar9, (int)uVar8 < 0)) || (p->vCis->nSize <= (int)uVar8))
        goto LAB_006f875c;
        *(undefined8 *)((long)p->vCis->pArray[uVar8] + 0x28) =
             *(undefined8 *)((long)p->vCos->pArray[uVar3] + 0x28);
        iVar9 = iVar9 + 1;
      } while (iVar9 < p->nRegs);
    }
  }
  iVar9 = vCut->nSize;
  if (0 < iVar9) {
    lVar10 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)vCut->pArray[lVar10] + 0x18) & 7) - 7) {
        *(undefined8 *)((long)vCut->pArray[lVar10] + 0x28) = 0;
        iVar9 = vCut->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9);
  }
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar10 = 0;
    do {
      if ((p->vCis->nSize <= lVar10) || (p_00->vCis->nSize <= lVar10)) goto LAB_006f875c;
      *(void **)((long)p->vCis->pArray[lVar10] + 0x28) = p_00->vCis->pArray[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nTruePis);
  }
  if (0 < p->nTruePos) {
    lVar10 = 0;
    do {
      if (p->vCos->nSize <= lVar10) {
LAB_006f875c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vCos->pArray[lVar10];
      Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006f877b:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar6);
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nTruePos);
  }
  if (0 < vCut->nSize) {
    lVar10 = 0;
    do {
      pAVar6 = (Aig_Obj_t *)vCut->pArray[lVar10];
      Saig_ManRetimeDup_rec(p_00,pAVar6);
      if (vInit == (Vec_Int_t *)0x0) {
        uVar7 = 0;
      }
      else {
        if (vInit->nSize <= lVar10) {
LAB_006f879a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar7 = (ulong)vInit->pArray[lVar10];
      }
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(uVar7 ^ (ulong)(pAVar6->field_5).pData));
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCut->nSize);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupBackward( Aig_Man_t * p, Vec_Ptr_t * vCut, Vec_Int_t * vInit )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), vInit?Vec_IntEntry(vInit,i):0 );
    // duplicate logic above the cut and remember values
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjChild0Copy(pObj);
    }
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // replicate the data on the constant node and the PIs
    pObj = Aig_ManConst1(p);
    pObj->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // duplicate logic below the cut
    Saig_ManForEachPo( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, vInit?Vec_IntEntry(vInit,i):0) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}